

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_tex_coords_decoder.h
# Opt level: O2

bool __thiscall
draco::
MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
::ComputePredictedValue
          (MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
           *this,CornerIndex corner_id,int *data,int data_id)

{
  CornerTable *pCVar1;
  int *piVar2;
  ulong *puVar3;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> IVar4;
  const_reference pvVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  size_type __n;
  bool bVar11;
  bool bVar12;
  Scalar SVar13;
  Scalar SVar14;
  double dVar15;
  double dVar16;
  float fVar17;
  ulong uVar18;
  float fVar19;
  uint uVar20;
  reference rVar21;
  float s;
  VectorD<float,_2> local_b8;
  Self local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  Vector2f pn_uv;
  Vector3f tip_pos;
  Vector3f cn;
  Vector3f pn;
  VectorD<float,_3> local_54;
  Vector3f prev_pos;
  Vector3f next_pos;
  
  __n = 0xffffffffffffffff;
  if (corner_id.value_ == 0xffffffff) {
    IVar4.value_ = 0xffffffff;
  }
  else {
    uVar20 = corner_id.value_ - 2;
    if ((corner_id.value_ + 1) % 3 != 0) {
      uVar20 = corner_id.value_ + 1;
    }
    uVar9 = (-(uint)(corner_id.value_ % 3 != 0) | 2) + corner_id.value_;
    pCVar1 = (this->
             super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
             ).mesh_data_.corner_table_;
    if (uVar20 == 0xffffffff) {
      IVar4.value_ = 0xffffffff;
    }
    else {
      IVar4.value_ = (pCVar1->corner_to_vertex_map_).vector_.
                     super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar20].value_;
    }
    if (uVar9 != 0xffffffff) {
      __n = (size_type)
            (int)(pCVar1->corner_to_vertex_map_).vector_.
                 super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar9].value_;
    }
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     ((this->
                      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                      ).mesh_data_.vertex_to_data_map_,(long)(int)IVar4.value_);
  iVar8 = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::at
                     ((this->
                      super_MeshPredictionSchemeDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                      ).mesh_data_.vertex_to_data_map_,__n);
  if ((*pvVar5 < data_id) && (iVar8 < data_id)) {
    local_b0.v_._M_elems[0] = (float)(int)*(undefined8 *)(data + this->num_components_ * iVar8);
    local_b0.v_._M_elems[1] =
         (float)(int)((ulong)*(undefined8 *)(data + this->num_components_ * iVar8) >> 0x20);
    local_b8.v_._M_elems[0] = (float)(int)*(undefined8 *)(data + this->num_components_ * *pvVar5);
    local_b8.v_._M_elems[1] =
         (float)(int)((ulong)*(undefined8 *)(data + this->num_components_ * *pvVar5) >> 0x20);
    if (((local_b8.v_._M_elems[0] != local_b0.v_._M_elems[0]) ||
        (NAN(local_b8.v_._M_elems[0]) || NAN(local_b0.v_._M_elems[0]))) ||
       (local_b8.v_._M_elems[1] != local_b0.v_._M_elems[1])) {
      iVar8 = (int)this;
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                  *)&tip_pos,iVar8);
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                  *)&next_pos,iVar8);
      GetPositionForEntryId
                ((MeshPredictionSchemeTexCoordsDecoder<int,_draco::PredictionSchemeWrapDecodingTransform<int,_int>,_draco::MeshPredictionSchemeData<draco::CornerTable>_>
                  *)&prev_pos,iVar8);
      VectorD<float,_3>::operator-(&pn,(Self *)&prev_pos);
      VectorD<float,_3>::operator-(&cn,(Self *)&tip_pos);
      SVar13 = VectorD<float,_3>::SquaredNorm(&pn);
      if ((0.0 < SVar13) || (this->version_ < 0x102)) {
        SVar14 = VectorD<float,_3>::Dot(&pn,&cn);
        s = SVar14 / SVar13;
        VectorD<float,_3>::operator*(&local_54,(Scalar *)&pn);
        VectorD<float,_3>::operator-((VectorD<float,_3> *)&pn_uv,&cn);
        SVar14 = VectorD<float,_3>::SquaredNorm((VectorD<float,_3> *)&pn_uv);
        fVar19 = SVar14 / SVar13;
        if (fVar19 < 0.0) {
          fVar19 = sqrtf(fVar19);
        }
        else {
          fVar19 = SQRT(fVar19);
        }
      }
      else {
        s = 0.0;
        fVar19 = 0.0;
      }
      VectorD<float,_2>::operator-(&local_b8,&local_b0);
      bVar11 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p !=
               (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
      bVar12 = (this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset != 0;
      bVar7 = bVar12 || bVar11;
      if (bVar12 || bVar11) {
        fVar17 = pn_uv.v_._M_elems[1] * fVar19;
        fVar19 = fVar19 * pn_uv.v_._M_elems[0];
        local_a8._0_4_ = s * pn_uv.v_._M_elems[0] + local_b0.v_._M_elems[0];
        local_a8._4_4_ = s * pn_uv.v_._M_elems[1] + local_b0.v_._M_elems[1];
        uStack_a0 = (double)CONCAT44(s * 0.0 + 0.0,s * 0.0 + 0.0);
        rVar21 = std::vector<bool,_std::allocator<bool>_>::back(&this->orientations_);
        uVar18 = *rVar21._M_p;
        std::_Bit_iterator_base::_M_bump_down
                  (&(this->orientations_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base);
        uVar20 = (uint)((uVar18 & rVar21._M_mask) == 0);
        uVar9 = (int)(uVar20 << 0x1f) >> 0x1f;
        uVar20 = (int)(uVar20 << 0x1f) >> 0x1f;
        fVar19 = (float)(~uVar20 & (uint)fVar19 | (uint)-fVar19 & uVar20) + local_a8._4_4_;
        puVar3 = (ulong *)(this->predicted_value_)._M_t.
                          super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl;
        local_a8 = (double)((float)(~uVar9 & (uint)-fVar17 | (uint)fVar17 & uVar9) + (float)local_a8
                           ) + 0.5;
        uStack_a0 = (double)fVar19 + 0.5;
        dVar15 = floor(local_a8);
        dVar16 = floor(uStack_a0);
        uVar18 = CONCAT44(-(uint)(2147483647.0 < dVar16 || dVar16 < -2147483648.0),
                          -(uint)(2147483647.0 < dVar15 || dVar15 < -2147483648.0));
        *puVar3 = uVar18 & (ulong)DAT_0018e060 | ~uVar18 & CONCAT44((int)dVar16,(int)dVar15);
        return bVar7;
      }
      return bVar7;
    }
    tip_pos.v_._M_elems[0] = 0.0;
    tip_pos.v_._M_elems[1] = 1.4013e-45;
    piVar2 = (this->predicted_value_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
             _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 4) {
      iVar8 = *(int *)((long)tip_pos.v_._M_elems + lVar6);
      fVar19 = local_b8.v_._M_elems[iVar8];
      iVar10 = -0x80000000;
      if (fVar19 <= 2.1474836e+09) {
        iVar10 = (int)fVar19;
      }
      if (NAN(fVar19)) {
        iVar10 = -0x80000000;
      }
      if (fVar19 < -2.1474836e+09) {
        iVar10 = -0x80000000;
      }
      piVar2[iVar8] = iVar10;
    }
  }
  else {
    if (data_id <= iVar8) {
      if (data_id < 1) {
        piVar2 = (this->predicted_value_)._M_t.
                 super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        for (lVar6 = 0; lVar6 < this->num_components_; lVar6 = lVar6 + 1) {
          piVar2[lVar6] = 0;
        }
        return true;
      }
      iVar8 = data_id + -1;
    }
    iVar10 = this->num_components_;
    iVar8 = iVar8 * iVar10;
    piVar2 = (this->predicted_value_)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
             _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    for (lVar6 = 0; lVar6 < iVar10; lVar6 = lVar6 + 1) {
      piVar2[lVar6] = data[iVar8 + lVar6];
      iVar10 = this->num_components_;
    }
  }
  return true;
}

Assistant:

bool MeshPredictionSchemeTexCoordsDecoder<DataTypeT, TransformT, MeshDataT>::
    ComputePredictedValue(CornerIndex corner_id, const DataTypeT *data,
                          int data_id) {
  // Compute the predicted UV coordinate from the positions on all corners
  // of the processed triangle. For the best prediction, the UV coordinates
  // on the next/previous corners need to be already encoded/decoded.
  const CornerIndex next_corner_id =
      this->mesh_data().corner_table()->Next(corner_id);
  const CornerIndex prev_corner_id =
      this->mesh_data().corner_table()->Previous(corner_id);
  // Get the encoded data ids from the next and previous corners.
  // The data id is the encoding order of the UV coordinates.
  int next_data_id, prev_data_id;

  int next_vert_id, prev_vert_id;
  next_vert_id =
      this->mesh_data().corner_table()->Vertex(next_corner_id).value();
  prev_vert_id =
      this->mesh_data().corner_table()->Vertex(prev_corner_id).value();

  next_data_id = this->mesh_data().vertex_to_data_map()->at(next_vert_id);
  prev_data_id = this->mesh_data().vertex_to_data_map()->at(prev_vert_id);

  if (prev_data_id < data_id && next_data_id < data_id) {
    // Both other corners have available UV coordinates for prediction.
    const Vector2f n_uv = GetTexCoordForEntryId(next_data_id, data);
    const Vector2f p_uv = GetTexCoordForEntryId(prev_data_id, data);
    if (p_uv == n_uv) {
      // We cannot do a reliable prediction on degenerated UV triangles.
      // Technically floats > INT_MAX are undefined, but compilers will
      // convert those values to INT_MIN. We are being explicit here for asan.
      for (const int i : {0, 1}) {
        if (std::isnan(p_uv[i]) || static_cast<double>(p_uv[i]) > INT_MAX ||
            static_cast<double>(p_uv[i]) < INT_MIN) {
          predicted_value_[i] = INT_MIN;
        } else {
          predicted_value_[i] = static_cast<int>(p_uv[i]);
        }
      }
      return true;
    }

    // Get positions at all corners.
    const Vector3f tip_pos = GetPositionForEntryId(data_id);
    const Vector3f next_pos = GetPositionForEntryId(next_data_id);
    const Vector3f prev_pos = GetPositionForEntryId(prev_data_id);
    // Use the positions of the above triangle to predict the texture coordinate
    // on the tip corner C.
    // Convert the triangle into a new coordinate system defined by orthogonal
    // bases vectors S, T, where S is vector prev_pos - next_pos and T is an
    // perpendicular vector to S in the same plane as vector the
    // tip_pos - next_pos.
    // The transformed triangle in the new coordinate system is then going to
    // be represented as:
    //
    //        1 ^
    //          |
    //          |
    //          |   C
    //          |  /  \
    //          | /      \
    //          |/          \
    //          N--------------P
    //          0              1
    //
    // Where next_pos point (N) is at position (0, 0), prev_pos point (P) is
    // at (1, 0). Our goal is to compute the position of the tip_pos point (C)
    // in this new coordinate space (s, t).
    //
    const Vector3f pn = prev_pos - next_pos;
    const Vector3f cn = tip_pos - next_pos;
    const float pn_norm2_squared = pn.SquaredNorm();
    // Coordinate s of the tip corner C is simply the dot product of the
    // normalized vectors |pn| and |cn| (normalized by the length of |pn|).
    // Since both of these vectors are normalized, we don't need to perform the
    // normalization explicitly and instead we can just use the squared norm
    // of |pn| as a denominator of the resulting dot product of non normalized
    // vectors.
    float s, t;
    // |pn_norm2_squared| can be exactly 0 when the next_pos and prev_pos are
    // the same positions (e.g. because they were quantized to the same
    // location).
    if (version_ < DRACO_BITSTREAM_VERSION(1, 2) || pn_norm2_squared > 0) {
      s = pn.Dot(cn) / pn_norm2_squared;
      // To get the coordinate t, we can use formula:
      //      t = |C-N - (P-N) * s| / |P-N|
      // Do not use std::sqrt to avoid changes in the bitstream.
      t = sqrt((cn - pn * s).SquaredNorm() / pn_norm2_squared);
    } else {
      s = 0;
      t = 0;
    }

    // Now we need to transform the point (s, t) to the texture coordinate space
    // UV. We know the UV coordinates on points N and P (N_UV and P_UV). Lets
    // denote P_UV - N_UV = PN_UV. PN_UV is then 2 dimensional vector that can
    // be used to define transformation from the normalized coordinate system
    // to the texture coordinate system using a 3x3 affine matrix M:
    //
    //  M = | PN_UV[0]  -PN_UV[1]  N_UV[0] |
    //      | PN_UV[1]   PN_UV[0]  N_UV[1] |
    //      | 0          0         1       |
    //
    // The predicted point C_UV in the texture space is then equal to
    // C_UV = M * (s, t, 1). Because the triangle in UV space may be flipped
    // around the PN_UV axis, we also need to consider point C_UV' = M * (s, -t)
    // as the prediction.
    const Vector2f pn_uv = p_uv - n_uv;
    const float pnus = pn_uv[0] * s + n_uv[0];
    const float pnut = pn_uv[0] * t;
    const float pnvs = pn_uv[1] * s + n_uv[1];
    const float pnvt = pn_uv[1] * t;
    Vector2f predicted_uv;
    if (orientations_.empty()) {
      return false;
    }

    // When decoding the data, we already know which orientation to use.
    const bool orientation = orientations_.back();
    orientations_.pop_back();
    if (orientation) {
      predicted_uv = Vector2f(pnus - pnvt, pnvs + pnut);
    } else {
      predicted_uv = Vector2f(pnus + pnvt, pnvs - pnut);
    }
    if (std::is_integral<DataTypeT>::value) {
      // Round the predicted value for integer types.
      // Technically floats > INT_MAX are undefined, but compilers will
      // convert those values to INT_MIN. We are being explicit here for asan.
      const double u = floor(predicted_uv[0] + 0.5);
      if (std::isnan(u) || u > INT_MAX || u < INT_MIN) {
        predicted_value_[0] = INT_MIN;
      } else {
        predicted_value_[0] = static_cast<int>(u);
      }
      const double v = floor(predicted_uv[1] + 0.5);
      if (std::isnan(v) || v > INT_MAX || v < INT_MIN) {
        predicted_value_[1] = INT_MIN;
      } else {
        predicted_value_[1] = static_cast<int>(v);
      }
    } else {
      predicted_value_[0] = static_cast<int>(predicted_uv[0]);
      predicted_value_[1] = static_cast<int>(predicted_uv[1]);
    }

    return true;
  }
  // Else we don't have available textures on both corners. For such case we
  // can't use positions for predicting the uv value and we resort to delta
  // coding.
  int data_offset = 0;
  if (prev_data_id < data_id) {
    // Use the value on the previous corner as the prediction.
    data_offset = prev_data_id * num_components_;
  }
  if (next_data_id < data_id) {
    // Use the value on the next corner as the prediction.
    data_offset = next_data_id * num_components_;
  } else {
    // None of the other corners have a valid value. Use the last encoded value
    // as the prediction if possible.
    if (data_id > 0) {
      data_offset = (data_id - 1) * num_components_;
    } else {
      // We are encoding the first value. Predict 0.
      for (int i = 0; i < num_components_; ++i) {
        predicted_value_[i] = 0;
      }
      return true;
    }
  }
  for (int i = 0; i < num_components_; ++i) {
    predicted_value_[i] = data[data_offset + i];
  }
  return true;
}